

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::ExportAscii(FBXExporter *this,char *pFile,IOSystem *pIOSystem)

{
  IOSystem *pIVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DeadlyImportError *this_00;
  element_type *peVar4;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  IOSystem *local_20;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  FBXExporter *this_local;
  
  this->binary = false;
  local_20 = pIOSystem;
  pIOSystem_local = (IOSystem *)pFile;
  pFile_local = &this->binary;
  iVar3 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset<Assimp::IOStream>
            (&(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>,
             (IOStream *)CONCAT44(extraout_var,iVar3));
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->outfile);
  if (!bVar2) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    pIVar1 = pIOSystem_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,(char *)pIVar1,&local_61);
    std::operator+(&local_40,"could not open output .fbx file: ",&local_60);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  WriteAsciiHeader(this);
  WriteAllNodes(this);
  peVar4 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  (*peVar4->_vptr_IOStream[3])(peVar4,"\n",1);
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->outfile).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void FBXExporter::ExportAscii (
    const char* pFile,
    IOSystem* pIOSystem
){
    // remember that we're exporting in ascii mode
    binary = false;

    // open the indicated file for writing in text mode
    outfile.reset(pIOSystem->Open(pFile,"wt"));
    if (!outfile) {
        throw DeadlyExportError(
            "could not open output .fbx file: " + std::string(pFile)
        );
    }

    // write the ascii header
    WriteAsciiHeader();

    // write all the sections
    WriteAllNodes();

    // make sure the file ends with a newline.
    // note: if the file is opened in text mode,
    // this should do the right cross-platform thing.
    outfile->Write("\n", 1, 1);

    // explicitly release file pointer,
    // so we don't have to rely on class destruction.
    outfile.reset();
}